

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

ByteData256 *
cfd::CreateConfidentialTxSighash
          (ByteData256 *__return_storage_ptr__,ConfidentialTransactionContext *transaction,
          OutPoint *outpoint,UtxoData *utxo,SigHashType *sighash_type,Pubkey *pubkey,
          Script *redeem_script,WitnessVersion version,ByteData *param_8,TaprootScriptTree *param_9)

{
  bool bVar1;
  ConfidentialValue value;
  ConfidentialValue local_b0;
  ConfidentialValue local_88;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  SigHashType local_48;
  SigHashType local_3c;
  
  core::ConfidentialValue::ConfidentialValue(&local_88);
  bVar1 = core::ConfidentialValue::IsEmpty(&utxo->value_commitment);
  if (bVar1) {
    core::ConfidentialValue::ConfidentialValue(&local_b0,&utxo->amount);
    core::ConfidentialValue::operator=(&local_88,&local_b0);
    core::ConfidentialValue::~ConfidentialValue(&local_b0);
  }
  else {
    core::ConfidentialValue::operator=(&local_88,&utxo->value_commitment);
  }
  core::ByteData::ByteData((ByteData *)&local_b0);
  bVar1 = core::Script::IsEmpty(redeem_script);
  if (bVar1) {
    core::SigHashType::SigHashType(&local_3c,sighash_type);
    (*(transaction->super_ConfidentialTransaction).super_AbstractTransaction.
      _vptr_AbstractTransaction[0x16])
              (&local_60,transaction,outpoint,pubkey,&local_3c,&local_88,version);
  }
  else {
    core::SigHashType::SigHashType(&local_48,sighash_type);
    (*(transaction->super_ConfidentialTransaction).super_AbstractTransaction.
      _vptr_AbstractTransaction[0x17])
              (&local_60,transaction,outpoint,redeem_script,&local_48,&local_88,version);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0,&local_60);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
  core::ByteData256::ByteData256(__return_storage_ptr__,(ByteData *)&local_b0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0);
  core::ConfidentialValue::~ConfidentialValue(&local_88);
  return __return_storage_ptr__;
}

Assistant:

static ByteData256 CreateConfidentialTxSighash(
    const ConfidentialTransactionContext* transaction,
    const OutPoint& outpoint, const UtxoData& utxo,
    const SigHashType& sighash_type, const Pubkey& pubkey,
    const Script& redeem_script, WitnessVersion version, const ByteData*,
    const TaprootScriptTree*) {
  ConfidentialValue value;
  if (utxo.value_commitment.IsEmpty()) {
    value = ConfidentialValue(utxo.amount);
  } else {
    value = utxo.value_commitment;
  }
  ByteData sig;
  if (redeem_script.IsEmpty()) {
    sig = transaction->CreateSignatureHash(
        outpoint, pubkey, sighash_type, value, version);
  } else {
    sig = transaction->CreateSignatureHash(
        outpoint, redeem_script, sighash_type, value, version);
  }
  return ByteData256(sig);
}